

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalCreateARTIndex::Combine
          (PhysicalCreateARTIndex *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  bool bVar2;
  pointer this_00;
  type other_index;
  ConstraintException *this_01;
  string local_40;
  
  pLVar1 = input->local_state;
  this_00 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
            operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                        *)(input->global_state + 1));
  other_index = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
                operator*((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                           *)(pLVar1 + 1));
  bVar2 = BoundIndex::MergeIndexes(this_00,other_index);
  if (bVar2) {
    return FINISHED;
  }
  this_01 = (ConstraintException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Data contains duplicates on indexed column(s)","");
  ConstraintException::ConstraintException(this_01,&local_40);
  __cxa_throw(this_01,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkCombineResultType PhysicalCreateARTIndex::Combine(ExecutionContext &context,
                                                      OperatorSinkCombineInput &input) const {
	auto &g_state = input.global_state.Cast<CreateARTIndexGlobalSinkState>();

	// Merge the local index into the global index.
	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	if (!g_state.global_index->MergeIndexes(*l_state.local_index)) {
		throw ConstraintException("Data contains duplicates on indexed column(s)");
	}

	return SinkCombineResultType::FINISHED;
}